

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VisionFeaturePrint.pb.cc
# Opt level: O0

size_t __thiscall
CoreML::Specification::CoreMLModels::VisionFeaturePrint_Objects::ByteSizeLong
          (VisionFeaturePrint_Objects *this)

{
  bool bVar1;
  int iVar2;
  VisionFeaturePrint_Objects_ObjectsVersion VVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  size_t sVar4;
  long lVar5;
  int cached_size;
  int n;
  int i;
  uint32_t cached_has_bits;
  size_t total_size;
  VisionFeaturePrint_Objects *this_local;
  
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->output_);
  _i = google::protobuf::internal::FromIntSize(iVar2);
  _i = _i * 2;
  cached_size = 0;
  iVar2 = google::protobuf::
          RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::size(&this->output_);
  for (; cached_size < iVar2; cached_size = cached_size + 1) {
    value = google::protobuf::
            RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::Get(&this->output_,cached_size);
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(value);
    _i = sVar4 + _i;
  }
  VVar3 = _internal_version(this);
  if (VVar3 != VisionFeaturePrint_Objects_ObjectsVersion_OBJECTS_VERSION_INVALID) {
    VVar3 = _internal_version(this);
    sVar4 = google::protobuf::internal::WireFormatLite::EnumSize(VVar3);
    _i = sVar4 + 1 + _i;
  }
  bVar1 = google::protobuf::internal::InternalMetadata::have_unknown_fields
                    (&(this->super_MessageLite)._internal_metadata_);
  if (bVar1) {
    google::protobuf::internal::InternalMetadata::unknown_fields<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               google::protobuf::internal::GetEmptyString_abi_cxx11_);
    lVar5 = std::__cxx11::string::size();
    _i = lVar5 + _i;
  }
  iVar2 = google::protobuf::internal::ToCachedSize(_i);
  SetCachedSize(this,iVar2);
  return _i;
}

Assistant:

size_t VisionFeaturePrint_Objects::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  // repeated string output = 100;
  total_size += 2 *
      ::PROTOBUF_NAMESPACE_ID::internal::FromIntSize(output_.size());
  for (int i = 0, n = output_.size(); i < n; i++) {
    total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
      output_.Get(i));
  }

  // .CoreML.Specification.CoreMLModels.VisionFeaturePrint.Objects.ObjectsVersion version = 1;
  if (this->_internal_version() != 0) {
    total_size += 1 +
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::EnumSize(this->_internal_version());
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    total_size += _internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size();
  }
  int cached_size = ::PROTOBUF_NAMESPACE_ID::internal::ToCachedSize(total_size);
  SetCachedSize(cached_size);
  return total_size;
}